

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int Is8bOptimizable(VP8LMetadata *hdr)

{
  HTreeGroup *pHVar1;
  HuffmanCode **htrees;
  int i;
  VP8LMetadata *hdr_local;
  int local_4;
  
  if (hdr->color_cache_size_ < 1) {
    for (i = 0; i < hdr->num_htree_groups_; i = i + 1) {
      pHVar1 = hdr->htree_groups_;
      if (pHVar1[i].htrees[1]->bits != '\0') {
        return 0;
      }
      if (pHVar1[i].htrees[2]->bits != '\0') {
        return 0;
      }
      if (pHVar1[i].htrees[3]->bits != '\0') {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int Is8bOptimizable(const VP8LMetadata* const hdr) {
  int i;
  if (hdr->color_cache_size_ > 0) return 0;
  // When the Huffman tree contains only one symbol, we can skip the
  // call to ReadSymbol() for red/blue/alpha channels.
  for (i = 0; i < hdr->num_htree_groups_; ++i) {
    HuffmanCode** const htrees = hdr->htree_groups_[i].htrees;
    if (htrees[RED][0].bits > 0) return 0;
    if (htrees[BLUE][0].bits > 0) return 0;
    if (htrees[ALPHA][0].bits > 0) return 0;
  }
  return 1;
}